

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockrange.h
# Opt level: O1

CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
 __thiscall
snmalloc::LockRange::
Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
::alloc_range(Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
              *this,size_t size)

{
  CombiningLock *lock;
  __int_type _Var1;
  long *in_FS_OFFSET;
  PreventFork pf;
  CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  result;
  PreventFork local_51;
  void *local_50;
  size_t local_48;
  CombiningLockNode local_40;
  void **local_28;
  Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>_>
  *local_20;
  size_t *local_18;
  
  local_50 = (void *)0x0;
  lock = &this->spin_lock;
  local_48 = size;
  PreventFork::PreventFork(&local_51);
  if ((this->spin_lock).last._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    _Var1 = (lock->flag)._M_base._M_i;
    (lock->flag)._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) {
      local_50 = (void *)SmallBuddyRange::
                         Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>
                         ::alloc_range((Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4UL>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_12UL>::Type<snmalloc::SubRange<snmalloc::PALLinux,_6UL>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2UL>::Type<snmalloc::LargeBuddyRange<24UL,_63UL,_snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>,_14UL>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,_snmalloc::FlatPagemap<14UL,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_snmalloc::PALLinux,_false>,_snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>_>,_false>_>::Type<snmalloc::PalRange<snmalloc::PALLinux>_>_>_>_>_>_>_>_>_>_>_>_>_>
                                        *)this,local_48);
      (this->spin_lock).flag._M_base._M_i = false;
      goto LAB_00108417;
    }
  }
  local_40.status._M_i = WAITING;
  local_40.next._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_40.f_raw =
       CombiningLockNodeTempl<snmalloc::LockRange::Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4ul>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,12ul>::Type<snmalloc::SubRange<snmalloc::PALLinux,6ul>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2ul>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,14ul>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>>::Type<snmalloc::PalRange<snmalloc::PALLinux>>>>>>>>>>>>>>>::alloc_range(unsigned_long)::{lambda(snmalloc::CombiningLockNode*)#1}()#1}>
       ::
       CombiningLockNodeTempl(snmalloc::CombiningLock&,snmalloc::LockRange::Type<snmalloc::SmallBuddyRange::Type<snmalloc::StatsRange::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<4ul>::Type<snmalloc::NopRange::Type<snmalloc::CommitRange<snmalloc::PALLinux>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,12ul>::Type<snmalloc::SubRange<snmalloc::PALLinux,6ul>::Type<snmalloc::GlobalRange::Type<snmalloc::LogRange<2ul>::Type<snmalloc::LargeBuddyRange<24ul,63ul,snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>,14ul>::Type<snmalloc::PagemapRegisterRange<snmalloc::DummyAuthmap>::Type<snmalloc::PagemapRegisterRange<snmalloc::BasicPagemap<snmalloc::PALLinux,snmalloc::FlatPagemap<14ul,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,snmalloc::PALLinux,false>,snmalloc::DefaultPagemapEntryT<snmalloc::DefaultSlabMetadata<snmalloc::NoClientMetaDataProvider>>,false>>::Type<snmalloc::PalRange<snmalloc::PALLinux>>>>>>>>>>>>>>>::alloc_range(unsigned_long)::{lambda(snmalloc::CombiningLockNode*)#1}()#1}&&)
       ::{lambda(snmalloc::CombiningLockNode*)#1}::CombiningLockNode__;
  local_28 = &local_50;
  local_18 = &local_48;
  local_20 = this;
  CombiningLockNode::attach_slow(&local_40,lock);
LAB_00108417:
  *in_FS_OFFSET = *in_FS_OFFSET + -1;
  if (*in_FS_OFFSET == 0) {
    LOCK();
    PreventFork::threads_preventing_fork.super___atomic_base<unsigned_long>._M_i =
         (__atomic_base<unsigned_long>)
         ((long)PreventFork::threads_preventing_fork.super___atomic_base<unsigned_long>._M_i + -2);
    UNLOCK();
  }
  return (CapPtr<void,_snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
          )local_50;
}

Assistant:

CapPtr<void, ChunkBounds> alloc_range(size_t size)
      {
        CapPtr<void, ChunkBounds> result;
        with(spin_lock, [&]() {
          {
            result = parent.alloc_range(size);
          }
        });
        return result;
      }